

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hh
# Opt level: O2

void __thiscall xt::RuntimeException::~RuntimeException(RuntimeException *this)

{
  *(undefined ***)this = &PTR__RuntimeException_0010cbe0;
  std::__cxx11::string::~string((string *)&this->data);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

RuntimeException(const std::string& error) : data(error) {}